

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
cxxpool::
get<std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<std::future<unsigned_long>*,std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>>,void>
          (__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
           first,__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                 last,vector<unsigned_long,_std::allocator<unsigned_long>_> *result)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  bool bVar1;
  pointer this_00;
  unsigned_long local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *result_local;
  __normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
  last_local;
  __normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
  first_local;
  
  local_20 = result;
  result_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                        *)&result_local);
    this = local_20;
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
              ::operator->(&last_local);
    local_28 = std::future<unsigned_long>::get(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this,&local_28);
    __gnu_cxx::
    __normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
    ::operator++(&last_local);
  }
  return local_20;
}

Assistant:

inline
Result &get(Iterator first, Iterator last, Result &result) {
    for (; first != last; ++first)
        result.push_back(first->get());
    return result;
}